

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetRepeatedString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,int index,
          string *value)

{
  CppType CVar1;
  uint32 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedString","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetRepeatedString",
               "Field is singular; the method requires a repeated field.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetRepeatedString",CPPTYPE_STRING);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar2 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    ExtensionSet::SetRepeatedString
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
               *(int *)(field + 0x38),index,value);
    return;
  }
  pbVar3 = MutableRepeatedField<std::__cxx11::string>(this,message,field,index);
  std::__cxx11::string::_M_assign((string *)pbVar3);
  return;
}

Assistant:

void GeneratedMessageReflection::SetRepeatedString(
    Message* message, const FieldDescriptor* field,
    int index, const string& value) const {
  USAGE_CHECK_ALL(SetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedString(
      field->number(), index, value);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        *MutableRepeatedField<string>(message, field, index) = value;
        break;
    }
  }
}